

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

PackedUnionType * __thiscall
slang::BumpAllocator::
emplace<slang::ast::PackedUnionType,slang::ast::Compilation&,bool_const&,bool_const&,bool_const&,slang::SourceLocation,slang::ast::ASTContext_const&>
          (BumpAllocator *this,Compilation *args,bool *args_1,bool *args_2,bool *args_3,
          SourceLocation *args_4,ASTContext *args_5)

{
  PackedUnionType *this_00;
  
  this_00 = (PackedUnionType *)allocate(this,0x98,8);
  ast::PackedUnionType::PackedUnionType(this_00,args,*args_1,*args_2,*args_3,*args_4,args_5);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }